

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void Rml::Parse::Function
               (DataParser *parser,Instruction function_type,String *func_name,
               bool first_argument_piped)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  uint num_arguments;
  allocator<char> local_59;
  String *local_58;
  String local_50;
  
  if (((function_type != EventFnc) && (function_type != TransformFnc)) &&
     (bVar3 = Assert("RMLUI_ASSERT(function_type == Instruction::TransformFnc || function_type == Instruction::EventFnc)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0x363), !bVar3)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  num_arguments = (uint)first_argument_piped;
  if ((parser->reached_end == false) &&
     ((parser->expression)._M_dataplus._M_p[parser->index] == '(')) {
    DataParser::Match(parser,'(',true);
    bVar3 = true;
    local_58 = func_name;
    if ((parser->reached_end == false) &&
       ((parser->expression)._M_dataplus._M_p[parser->index] == ')')) {
      DataParser::Match(parser,')',true);
      bVar3 = false;
    }
    while (func_name = local_58, bVar3) {
      Expression(parser);
      DataParser::Push(parser);
      if (parser->reached_end == false) {
        cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
        if (cVar1 != ',') {
          if (cVar1 != ')') goto LAB_002607ca;
          DataParser::Match(parser,')',true);
          goto LAB_002607eb;
        }
        DataParser::Match(parser,',',true);
        bVar3 = true;
      }
      else {
LAB_002607ca:
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"one of \')\' or \',\'",&local_59);
        DataParser::Expected(parser,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
LAB_002607eb:
        bVar3 = false;
      }
      num_arguments = num_arguments + 1;
    }
  }
  else {
    DataParser::SkipWhitespace(parser);
  }
  DataParser::Function(parser,function_type,num_arguments,func_name);
  return;
}

Assistant:

static void Function(DataParser& parser, Instruction function_type, String&& func_name, bool first_argument_piped)
	{
		RMLUI_ASSERT(function_type == Instruction::TransformFnc || function_type == Instruction::EventFnc);

		// We already matched the variable name, and also pushed the first argument to the stack if it was piped using '|'.
		int num_arguments = first_argument_piped ? 1 : 0;
		if (parser.Look() == '(')
		{
			bool looping = true;

			parser.Match('(');
			if (parser.Look() == ')')
			{
				parser.Match(')');
				looping = false;
			}

			while (looping)
			{
				num_arguments += 1;
				Expression(parser);
				parser.Push();

				switch (parser.Look())
				{
				case ')':
					parser.Match(')');
					looping = false;
					break;
				case ',': parser.Match(','); break;
				default:
					parser.Expected("one of ')' or ','");
					looping = false;
					break;
				}
			}
		}
		else
		{
			parser.SkipWhitespace();
		}

		parser.Function(function_type, num_arguments, std::move(func_name));
	}